

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O2

void __thiscall
FlatMap<double,MyStruct,std::less<double>>::insert<std::pair<double,MyStruct>const*>
          (FlatMap<double,MyStruct,std::less<double>> *this,pair<double,_MyStruct> *first,
          pair<double,_MyStruct> *last)

{
  iterator iVar1;
  __normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
  __first;
  
  if (first != last) {
    iVar1 = std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>::
            insert<std::pair<double,MyStruct>const*,void>
                      ((vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>
                        *)this,*(pair<double,_MyStruct> **)(this + 8),first,last);
    std::
    __stable_sort<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<double,MyStruct,std::less<double>>::ValueToValueComparator>>
              (iVar1._M_current,*(undefined8 *)(this + 8));
    std::
    __inplace_merge<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<double,MyStruct,std::less<double>>::ValueToValueComparator>>
              (*(undefined8 *)this,iVar1._M_current,*(undefined8 *)(this + 8));
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,__gnu_cxx::__ops::_Iter_comp_iter<FlatMap<double,MyStruct,std::less<double>>::insert<std::pair<double,MyStruct>const*>(std::pair<double,MyStruct>const*,std::pair<double,MyStruct>const*)::_lambda(std::pair<double,MyStruct>const&,std::pair<double,MyStruct>const&)_1_>>
                        (*(pair<double,_MyStruct> **)this,*(pair<double,_MyStruct> **)(this + 8),
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_tdepke2[P]CircuitSim2_src___FlatMap_h:175:62)>
                          )this);
    std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>::erase
              ((vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_> *
               )this,(const_iterator)__first._M_current,*(pair<double,_MyStruct> **)(this + 8));
    return;
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
        if (first == last) {
            return;
        }

        auto insertStart = vec_.insert(vec_.end(), first, last);
        std::stable_sort(insertStart, vec_.end(), valueToValueComp_);
        std::inplace_merge(vec_.begin(), insertStart, vec_.end(), valueToValueComp_);
        auto newLast = std::unique(vec_.begin(), vec_.end(), [this](const value_type& lhs, const value_type& rhs) {
            return !comp_(lhs.first, rhs.first);
        });
        vec_.erase(newLast, vec_.end());

        //mergeUnique(first, last);
    }